

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui-ext.cpp
# Opt level: O0

void ImDrawList_AddRect(ImDrawList *self,ImVec2 a,ImVec2 b,ImU32 col,float rounding,
                       int rounding_corners_flags,float thickness)

{
  float thickness_local;
  int rounding_corners_flags_local;
  float rounding_local;
  ImU32 col_local;
  ImDrawList *self_local;
  ImVec2 b_local;
  ImVec2 a_local;
  
  self_local = (ImDrawList *)b;
  b_local = a;
  ImDrawList::AddRect(self,&b_local,(ImVec2 *)&self_local,col,rounding,rounding_corners_flags,
                      thickness);
  return;
}

Assistant:

CIMGUI_API void _ImDrawList_AddRect (ImDrawList *larg1, ImVec2 const *larg2, ImVec2 const *larg3, ImU32 *larg4, float larg5, int larg6, float larg7) {
  ImDrawList *arg1 = (ImDrawList *) 0 ;
  ImVec2 arg2 ;
  ImVec2 arg3 ;
  ImU32 arg4 ;
  float arg5 ;
  int arg6 ;
  float arg7 ;
  
  arg1 = larg1;
  arg2 = *larg2;
  arg3 = *larg3;
  arg4 = *larg4;
  arg5 = larg5;
  arg6 = larg6;
  arg7 = larg7;
  try {
    ImDrawList_AddRect(arg1,arg2,arg3,arg4,arg5,arg6,arg7);
    
  } catch (...) {
    
  }
}